

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::getFormattedString(XMLAbstractDoubleFloat *this)

{
  XMLCh **ppXVar1;
  
  if (this->fDataConverted == false) {
    ppXVar1 = &this->fRawData;
  }
  else {
    ppXVar1 = &this->fFormattedString;
    if (this->fFormattedString == (XMLCh *)0x0) {
      formatString(this);
    }
  }
  return *ppXVar1;
}

Assistant:

const XMLCh*  XMLAbstractDoubleFloat::getFormattedString() const
{
    if (!fDataConverted)
    {
        return fRawData;
    }
    else 
    {
        if (!fFormattedString)    	
        {
            XMLAbstractDoubleFloat *temp = (XMLAbstractDoubleFloat *) this;
            temp->formatString();
        }

        return fFormattedString;           
    }

}